

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string_view name)

{
  string_view key;
  string_view name_00;
  string_view name_01;
  string_view key_00;
  string_view key_01;
  bool bVar1;
  pointer this_00;
  size_t sVar2;
  MutexLockMaybe local_350;
  MutexLockMaybe lock_1;
  Symbol result;
  DeferredValidation deferred_validation;
  ReaderMutexLock local_38;
  ReaderMutexLock lock;
  DescriptorPool *pool_local;
  Tables *this_local;
  string_view name_local;
  Symbol result_1;
  
  name_local._M_len = (size_t)name._M_str;
  sVar2 = name._M_len;
  lock.mu_ = &pool->field_memo_table_mutex_;
  if (pool->mutex_ == (Mutex *)0x0) goto LAB_002db483;
  absl::lts_20250127::ReaderMutexLock::ReaderMutexLock(&local_38,pool->mutex_);
  bVar1 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(this->known_bad_symbols_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  if ((bVar1) &&
     (bVar1 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&(this->known_bad_files_).
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ), bVar1)) {
    key_01._M_str = (char *)name_local._M_len;
    key_01._M_len = sVar2;
    name_local._M_str = (char *)FindSymbol(this,key_01);
    bVar1 = Symbol::IsNull((Symbol *)&name_local._M_str);
    if (bVar1) goto LAB_002db463;
    bVar1 = true;
  }
  else {
LAB_002db463:
    bVar1 = false;
  }
  absl::lts_20250127::ReaderMutexLock::~ReaderMutexLock(&local_38);
  if (bVar1) {
    return (Symbol)(SymbolBase *)name_local._M_str;
  }
LAB_002db483:
  DeferredValidation::DeferredValidation((DeferredValidation *)&result,(DescriptorPool *)lock.mu_);
  Symbol::Symbol((Symbol *)&lock_1);
  absl::lts_20250127::MutexLockMaybe::MutexLockMaybe
            (&local_350,(Mutex *)lock.mu_[2].mu_.super___atomic_base<long>._M_i);
  if (lock.mu_[3].mu_.super___atomic_base<long>._M_i != 0) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->known_bad_symbols_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->known_bad_files_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  }
  key_00._M_str = (char *)name_local._M_len;
  key_00._M_len = sVar2;
  lock_1.mu_ = (Mutex *)FindSymbol(this,key_00);
  bVar1 = Symbol::IsNull((Symbol *)&lock_1);
  if ((bVar1) && (lock.mu_[5].mu_.super___atomic_base<long>._M_i != 0)) {
    this_00 = std::
              unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            *)(lock.mu_[5].mu_.super___atomic_base<long>._M_i + 0x38));
    name_01._M_str = (char *)name_local._M_len;
    name_01._M_len = sVar2;
    lock_1.mu_ = (Mutex *)FindByNameHelper(this_00,(DescriptorPool *)
                                                   lock.mu_[5].mu_.super___atomic_base<long>._M_i,
                                           name_01);
  }
  bVar1 = Symbol::IsNull((Symbol *)&lock_1);
  if ((bVar1) &&
     (name_00._M_str = (char *)name_local._M_len, name_00._M_len = sVar2,
     bVar1 = TryFindSymbolInFallbackDatabase
                       ((DescriptorPool *)lock.mu_,name_00,(DeferredValidation *)&result), bVar1)) {
    key._M_str = (char *)name_local._M_len;
    key._M_len = sVar2;
    lock_1.mu_ = (Mutex *)FindSymbol(this,key);
  }
  absl::lts_20250127::MutexLockMaybe::~MutexLockMaybe(&local_350);
  bVar1 = DeferredValidation::Validate((DeferredValidation *)&result);
  if (bVar1) {
    name_local._M_str = (char *)lock_1.mu_;
  }
  else {
    Symbol::Symbol((Symbol *)&name_local._M_str);
  }
  DeferredValidation::~DeferredValidation((DeferredValidation *)&result);
  return (Symbol)(SymbolBase *)name_local._M_str;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                absl::string_view name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    absl::ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  DescriptorPool::DeferredValidation deferred_validation(pool);
  Symbol result;
  {
    absl::MutexLockMaybe lock(pool->mutex_);
    if (pool->fallback_database_ != nullptr) {
      known_bad_symbols_.clear();
      known_bad_files_.clear();
    }
    result = FindSymbol(name);

    if (result.IsNull() && pool->underlay_ != nullptr) {
      // Symbol not found; check the underlay.
      result =
          pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
    }

    if (result.IsNull()) {
      // Symbol still not found, so check fallback database.
      if (pool->TryFindSymbolInFallbackDatabase(name, deferred_validation)) {
        result = FindSymbol(name);
      }
    }
  }

  if (!deferred_validation.Validate()) {
    return Symbol();
  }
  return result;
}